

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O3

void __thiscall FHealthBar::FHealthBar(FHealthBar *this)

{
  BYTE BVar1;
  long lVar2;
  byte *pbVar3;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FTexture_00705930;
  this->VialLevel = 0;
  this->NeedRefresh = false;
  (this->super_FTexture).Width = 200;
  (this->super_FTexture).Height = 2;
  (this->super_FTexture).WidthBits = '\b';
  (this->super_FTexture).HeightBits = '\x01';
  (this->super_FTexture).WidthMask = 0xff;
  pbVar3 = FHealthBar::rgbs + 2;
  lVar2 = 0x1e4;
  do {
    BVar1 = FColorMatcher::Pick(&ColorMatcher,(uint)pbVar3[-2],(uint)pbVar3[-1],(uint)*pbVar3);
    *(BYTE *)((long)&(this->super_FTexture)._vptr_FTexture + lVar2) = BVar1;
    pbVar3 = pbVar3 + 3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x1ec);
  return;
}

Assistant:

FHealthBar::FHealthBar ()
: VialLevel(0), NeedRefresh(false)
{
	int i;

	static const BYTE rgbs[8*3] =
	{
		180, 228, 128,	// light green
		128, 180, 80,	// dark green

		196, 204, 252,	// light blue
		148, 152, 200,	// dark blue

		224, 188, 0,	// light gold
		208, 128, 0,	// dark gold

		216, 44,  44,	// light red
		172, 28,  28	// dark red
	};

	Width = 200;
	Height = 2;
	WidthBits = 8;
	HeightBits = 1;
	WidthMask = 255;

	for (i = 0; i < 8; ++i)
	{
		Colors[i] = ColorMatcher.Pick (rgbs[i*3], rgbs[i*3+1], rgbs[i*3+2]);
	}
}